

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTrace.cpp
# Opt level: O3

bool idx2::PrintStacktrace(printer *Pr)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *__ptr;
  char *pcVar5;
  undefined1 *puVar6;
  FILE *pFVar7;
  char *pcVar8;
  undefined1 *puVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  int Status;
  size_t FuncNameSize;
  void *AddrList [64];
  char Buffer [128];
  char Buffer_1 [1024];
  char Syscom [1024];
  int local_acc;
  ulong local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8 [64];
  undefined1 local_8b8 [128];
  char local_838 [1024];
  char local_438 [1032];
  
  pFVar7 = (FILE *)Pr->File;
  if (Pr->Buf == (char *)0x0) {
    if (pFVar7 == (FILE *)0x0) goto LAB_0019c95f;
    fwrite("Stack trace:\n",0xd,1,pFVar7);
  }
  else {
    if (pFVar7 != (FILE *)0x0) {
LAB_0019c95f:
      pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c978:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                    ,0x6c,"bool idx2::PrintStacktrace(printer *)");
    }
    if ((long)Pr->Size < 2) {
      pcVar8 = "false && \"buffer too small\"";
      goto LAB_0019c978;
    }
    iVar2 = snprintf(Pr->Buf,(long)Pr->Size,"Stack trace:\n");
    Pr->Buf = Pr->Buf + iVar2;
    iVar3 = Pr->Size - iVar2;
    if (iVar3 == 0 || Pr->Size < iVar2) {
      pcVar8 = "false && \"buffer overflow?\"";
      goto LAB_0019c978;
    }
    Pr->Size = iVar3;
  }
  uVar4 = backtrace(local_ab8,0x40);
  if (uVar4 != 0) {
    __ptr = (void *)backtrace_symbols(local_ab8,uVar4);
    local_ac0 = 0x80;
    if (1 < (int)uVar4) {
      local_ac8 = (ulong)uVar4;
      puVar9 = local_8b8;
      uVar10 = 1;
      do {
        pcVar8 = *(char **)((long)__ptr + uVar10 * 8);
        pcVar5 = pcVar8;
        pcVar12 = (char *)0x0;
        pcVar14 = (char *)0x0;
LAB_0019c4ef:
        cVar1 = *pcVar5;
        pcVar11 = pcVar5;
        pcVar13 = pcVar14;
        if ((cVar1 == '(') || (pcVar11 = pcVar12, pcVar13 = pcVar5, cVar1 == '+')) {
LAB_0019c51c:
          pcVar5 = pcVar5 + 1;
          pcVar12 = pcVar11;
          pcVar14 = pcVar13;
          goto LAB_0019c4ef;
        }
        if (cVar1 != '\0') {
          pcVar13 = pcVar14;
          if (cVar1 == ')' && pcVar14 != (char *)0x0) goto LAB_0019c523;
          goto LAB_0019c51c;
        }
        pcVar5 = (char *)0x0;
LAB_0019c523:
        if (pcVar12 < pcVar14 &&
            (pcVar5 != (char *)0x0 && (pcVar14 != (char *)0x0 && pcVar12 != (char *)0x0))) {
          *pcVar12 = '\0';
          pcVar12 = pcVar12 + 1;
          *pcVar14 = '\0';
          pcVar14 = pcVar14 + 1;
          *pcVar5 = '\0';
          puVar6 = (undefined1 *)__cxa_demangle(pcVar12,puVar9,&local_ac0,&local_acc);
          pcVar8 = Pr->Buf;
          pFVar7 = (FILE *)Pr->File;
          if (local_acc == 0) {
            puVar9 = puVar6;
            if (pcVar8 == (char *)0x0) {
              if (pFVar7 == (FILE *)0x0) goto LAB_0019c92e;
              fprintf(pFVar7,"  %s: %s +%s [%p]\n",*(undefined8 *)((long)__ptr + uVar10 * 8),puVar6,
                      pcVar14,local_ab8[uVar10]);
            }
            else {
              if (pFVar7 != (FILE *)0x0) {
LAB_0019c92e:
                pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c947:
                __assert_fail(pcVar8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                              ,0x9a,"bool idx2::PrintStacktrace(printer *)");
              }
              if ((long)Pr->Size < 2) {
                pcVar8 = "false && \"buffer too small\"";
                goto LAB_0019c947;
              }
              iVar2 = snprintf(pcVar8,(long)Pr->Size,"  %s: %s +%s [%p]\n",
                               *(undefined8 *)((long)__ptr + uVar10 * 8),puVar6,pcVar14,
                               local_ab8[uVar10]);
              Pr->Buf = Pr->Buf + iVar2;
              iVar3 = Pr->Size - iVar2;
              if (iVar3 == 0 || Pr->Size < iVar2) {
                pcVar8 = "false && \"buffer overflow?\"";
                goto LAB_0019c947;
              }
              Pr->Size = iVar3;
            }
          }
          else if (pcVar8 == (char *)0x0) {
            if (pFVar7 == (FILE *)0x0) goto LAB_0019c8d5;
            fprintf(pFVar7,"  %s: %s() +%s [%p]\n",*(undefined8 *)((long)__ptr + uVar10 * 8),pcVar12
                    ,pcVar14,local_ab8[uVar10]);
          }
          else {
            if (pFVar7 != (FILE *)0x0) {
LAB_0019c8d5:
              pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c916:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0x9e,"bool idx2::PrintStacktrace(printer *)");
            }
            if ((long)Pr->Size < 2) {
              pcVar8 = "false && \"buffer too small\"";
              goto LAB_0019c916;
            }
            iVar2 = snprintf(pcVar8,(long)Pr->Size,"  %s: %s() +%s [%p]\n",
                             *(undefined8 *)((long)__ptr + uVar10 * 8),pcVar12,pcVar14,
                             local_ab8[uVar10]);
            Pr->Buf = Pr->Buf + iVar2;
            iVar3 = Pr->Size - iVar2;
            if (iVar3 == 0 || Pr->Size < iVar2) {
              pcVar8 = "false && \"buffer overflow?\"";
              goto LAB_0019c916;
            }
            Pr->Size = iVar3;
          }
          snprintf(local_438,0x400,"addr2line %p -e %s",local_ab8[uVar10],"main");
          pFVar7 = popen(local_438,"r");
          if (pFVar7 != (FILE *)0x0) {
            memset(local_838,0,0x400);
            while (pcVar8 = fgets(local_838,0x400,pFVar7), pcVar8 != (char *)0x0) {
              __stream = (FILE *)Pr->File;
              if (Pr->Buf == (char *)0x0) {
                if (__stream == (FILE *)0x0) {
LAB_0019c89b:
                  pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c8b4:
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                                ,0xaa,"bool idx2::PrintStacktrace(printer *)");
                }
                fprintf(__stream,"    %s",local_838);
              }
              else {
                if (__stream != (FILE *)0x0) goto LAB_0019c89b;
                if ((long)Pr->Size < 2) {
                  pcVar8 = "false && \"buffer too small\"";
                  goto LAB_0019c8b4;
                }
                iVar2 = snprintf(Pr->Buf,(long)Pr->Size,"    %s",local_838);
                Pr->Buf = Pr->Buf + iVar2;
                iVar3 = Pr->Size - iVar2;
                if (iVar3 == 0 || Pr->Size < iVar2) {
                  pcVar8 = "false && \"buffer overflow?\"";
                  goto LAB_0019c8b4;
                }
                Pr->Size = iVar3;
              }
            }
            pclose(pFVar7);
          }
        }
        else {
          pFVar7 = (FILE *)Pr->File;
          if (Pr->Buf == (char *)0x0) {
            if (pFVar7 == (FILE *)0x0) goto LAB_0019c8cc;
            fprintf(pFVar7,"  %s\n",pcVar8);
          }
          else {
            if (pFVar7 != (FILE *)0x0) {
LAB_0019c8cc:
              pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c8ee:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0xb0,"bool idx2::PrintStacktrace(printer *)");
            }
            if ((long)Pr->Size < 2) {
              pcVar8 = "false && \"buffer too small\"";
              goto LAB_0019c8ee;
            }
            iVar2 = snprintf(Pr->Buf,(long)Pr->Size,"  %s\n");
            Pr->Buf = Pr->Buf + iVar2;
            iVar3 = Pr->Size - iVar2;
            if (iVar3 == 0 || Pr->Size < iVar2) {
              pcVar8 = "false && \"buffer overflow?\"";
              goto LAB_0019c8ee;
            }
            Pr->Size = iVar3;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_ac8);
    }
    free(__ptr);
LAB_0019c884:
    return uVar4 != 0;
  }
  pFVar7 = (FILE *)Pr->File;
  if (Pr->Buf == (char *)0x0) {
    if (pFVar7 != (FILE *)0x0) {
      fwrite("  <empty, possibly corrupt>\n",0x1c,1,pFVar7);
      goto LAB_0019c884;
    }
  }
  else if (pFVar7 == (FILE *)0x0) {
    if ((long)Pr->Size < 2) {
      pcVar8 = "false && \"buffer too small\"";
    }
    else {
      iVar2 = snprintf(Pr->Buf,(long)Pr->Size,"  <empty, possibly corrupt>\n");
      Pr->Buf = Pr->Buf + iVar2;
      iVar3 = Pr->Size - iVar2;
      if (iVar3 != 0 && iVar2 <= Pr->Size) {
        Pr->Size = iVar3;
        goto LAB_0019c884;
      }
      pcVar8 = "false && \"buffer overflow?\"";
    }
    goto LAB_0019c9a9;
  }
  pcVar8 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0019c9a9:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                ,0x73,"bool idx2::PrintStacktrace(printer *)");
}

Assistant:

bool
PrintStacktrace(printer* Pr)
{
  idx2_Print(Pr, "Stack trace:\n");
  constexpr int MaxFrames = 63;
  void* AddrList[MaxFrames + 1]; // Storage array for stack trace address data
  /* Retrieve current stack addresses */
  int AddrLen = backtrace(AddrList, sizeof(AddrList) / sizeof(void*));
  if (AddrLen == 0)
  {
    idx2_Print(Pr, "  <empty, possibly corrupt>\n");
    return false;
  }
  /* Resolve addresses into strings containing "filename(function+address)", */
  char** SymbolList = backtrace_symbols(AddrList, AddrLen);
  size_t FuncNameSize = 128;
  char Buffer[128];
  char* FuncName = Buffer;
  // iterate over the returned symbol lines (skip the first)
  for (int I = 1; I < AddrLen; ++I)
  {
    // fprintf(stderr, "%s\n", SymbolList[I]);
    char *BeginName = 0, *BeginOffset = 0, *EndOffset = 0;
    /* Find parentheses and +address offset surrounding the mangled name:
    e.g., ./module(function+0x15c) [0x8048a6d] */
    for (char* P = SymbolList[I]; *P; ++P)
    {
      if (*P == '(')
        BeginName = P;
      else if (*P == '+')
        BeginOffset = P;
      else if (*P == ')' && BeginOffset)
      {
        EndOffset = P;
        break;
      }
    }
    if (BeginName && BeginOffset && EndOffset && BeginName < BeginOffset)
    {
      *BeginName++ = '\0';
      *BeginOffset++ = '\0';
      *EndOffset = '\0';
      /* mangled name is now in [BeginName, BeginOffset) and caller offset in
[BeginOffset, EndOffset) */
      int Status;
      char* Ret = abi::__cxa_demangle(BeginName, FuncName, &FuncNameSize, &Status);
      if (Status == 0)
      {
        FuncName = Ret; // use possibly realloc()-ed string
        idx2_Print(Pr, "  %s: %s +%s [%p]\n", SymbolList[I], FuncName, BeginOffset, AddrList[I]);
      }
      else
      { // demangling failed
        idx2_Print(Pr, "  %s: %s() +%s [%p]\n", SymbolList[I], BeginName, BeginOffset, AddrList[I]);
      }
      /* get file names and line numbers using addr2line */
      constexpr int BufLen = 1024;
      char Syscom[BufLen];
      // last parameter is the name of this app
      snprintf(Syscom, BufLen, "addr2line %p -e %s", AddrList[I], "main");
      FILE* F = popen(Syscom, "r");
      if (F)
      {
        char Buffer[BufLen] = { 0 };
        while (fgets(Buffer, sizeof(Buffer), F))
          idx2_Print(Pr, "    %s", Buffer);
        pclose(F);
      }
    }
    else
    { // couldn't parse the line? print the whole line.
      idx2_Print(Pr, "  %s\n", SymbolList[I]);
    }
  }
  free(SymbolList);
  return true;
}